

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O1

String * operator<<(String *str,int *t)

{
  Log l;
  Log local_40;
  Log local_30;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_20;
  
  local_20.mValue = 1;
  Log::Log(&local_40,str,(Flags<LogOutput::LogFlag> *)&local_20);
  if (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->spacing =
         false;
  }
  Log::addStringStream<int>(&local_30,(int)&local_40);
  if (local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return str;
}

Assistant:

String &operator<<(String &str, const T &t)
{
    Log l(&str);
    l.setSpacing(false);
    l << t;
    return str;
}